

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O2

int __thiscall bdHashSet::printHashSet(bdHashSet *this,ostream *out)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  time((time_t *)0x0);
  std::operator<<(out,"Hash: ");
  bdStdPrintNodeId(out,&this->mId);
  std::endl<char,std::char_traits<char>>(out);
  for (p_Var2 = (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mEntries)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(out,"\tK:");
    std::__cxx11::string::string((string *)&local_90,(string *)(p_Var2 + 1));
    bdStdConvertToPrintable(&local_b0,&local_90);
    std::operator<<(poVar1,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    poVar1 = std::operator<<(out," V:");
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 2));
    bdStdConvertToPrintable(&local_b0,&local_50);
    std::operator<<(poVar1,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    poVar1 = std::operator<<(out," A:");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1," L:");
    std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(out," S:");
    std::__cxx11::string::string((string *)&local_70,(string *)&p_Var2[3]._M_parent);
    bdStdConvertToPrintable(&local_b0,&local_70);
    std::operator<<(poVar1,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::endl<char,std::char_traits<char>>(out);
  }
  return 1;
}

Assistant:

int	bdHashSet::printHashSet(std::ostream &out) {
	time_t now = time(NULL);
	std::multimap<std::string, bdHashEntry>::iterator it;
	out << "Hash: ";
	bdStdPrintNodeId(out, &mId); // Allowing "Std" as we dont need dht functions everywhere.
	out << std::endl;

	for (it = mEntries.begin(); it != mEntries.end();it++) {
		time_t age = now - it->second.mStoreTS;
		out << "\tK:" << bdStdConvertToPrintable(it->first);
		out << " V:" << bdStdConvertToPrintable(it->second.mValue);
		out << " A:" << age << " L:" << it->second.mLifetime;
		out << " S:" << bdStdConvertToPrintable(it->second.mSecret);
		out << std::endl;
	}
	return 1;
}